

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worm.c
# Opt level: O2

void see_wsegs(monst *worm)

{
  ulong uVar1;
  wseg *pwVar2;
  
  uVar1 = (ulong)worm->wormno;
  if (uVar1 != 0) {
    pwVar2 = (wseg *)(level->wtails + uVar1);
    while (pwVar2 = pwVar2->nseg, pwVar2 != level->wheads[uVar1]) {
      newsym((int)pwVar2->wx,(int)pwVar2->wy);
      uVar1 = (ulong)worm->wormno;
    }
    return;
  }
  warning("see_wsegs: worm->wormno was 0");
  return;
}

Assistant:

void see_wsegs(struct monst *worm)
{
    struct wseg *curr = level->wtails[worm->wormno];

    if (!worm->wormno) {
	warning("see_wsegs: worm->wormno was 0");
	return;
    }

    while (curr != level->wheads[worm->wormno]) {
	newsym(curr->wx,curr->wy);
	curr = curr->nseg;
    }
}